

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_draw_cylinder(rf_vec3 position,float radius_top,float radius_bottom,float height,int sides,
                     rf_color color)

{
  rf_render_batch *prVar1;
  long lVar2;
  rf_vertex_buffer *prVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float __x;
  float local_48;
  float fStack_44;
  
  uVar10 = 3;
  if (3 < sides) {
    uVar10 = sides;
  }
  prVar1 = (rf__ctx->field_0).current_batch;
  lVar2 = prVar1->current_buffer;
  prVar3 = prVar1->vertex_buffers;
  if (prVar3[lVar2].elements_count * 4 <= (int)(uVar10 * 6 + prVar3[lVar2].v_counter)) {
    rf_gfx_draw();
  }
  rf_gfx_push_matrix();
  local_48 = position.x;
  fStack_44 = position.y;
  rf_gfx_translatef(local_48,fStack_44,position.z);
  rf_gfx_begin(RF_TRIANGLES);
  rf_gfx_color4ub(color.r,color.g,color.b,color.a);
  uVar8 = CONCAT44(0,uVar10);
  if (radius_top <= 0.0) {
    uVar9 = 0;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar8;
    do {
      rf_gfx_vertex3f(0.0,height,0.0);
      fVar11 = sinf((float)(long)uVar9 * 0.017453292);
      fVar12 = cosf((float)(long)uVar9 * 0.017453292);
      rf_gfx_vertex3f(fVar11 * radius_bottom,0.0,fVar12 * radius_bottom);
      fVar11 = (float)(long)(0x168 / (ulong)uVar10 + uVar9) * 0.017453292;
      fVar12 = sinf(fVar11);
      fVar11 = cosf(fVar11);
      rf_gfx_vertex3f(fVar12 * radius_bottom,0.0,fVar11 * radius_bottom);
      uVar9 = uVar9 + SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x168)) / auVar6,0);
    } while (uVar9 < 0x168);
  }
  else {
    uVar9 = 0;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar8;
    do {
      __x = (float)(long)uVar9 * 0.017453292;
      fVar11 = sinf(__x);
      fVar12 = cosf(__x);
      rf_gfx_vertex3f(fVar11 * radius_bottom,0.0,fVar12 * radius_bottom);
      fVar11 = (float)(long)(0x168 / (ulong)uVar10 + uVar9) * 0.017453292;
      fVar12 = sinf(fVar11);
      fVar13 = cosf(fVar11);
      rf_gfx_vertex3f(fVar12 * radius_bottom,0.0,fVar13 * radius_bottom);
      fVar12 = sinf(fVar11);
      fVar13 = cosf(fVar11);
      rf_gfx_vertex3f(fVar12 * radius_top,height,fVar13 * radius_top);
      fVar12 = sinf(__x);
      fVar13 = cosf(__x);
      rf_gfx_vertex3f(fVar12 * radius_top,height,fVar13 * radius_top);
      fVar12 = sinf(__x);
      fVar13 = cosf(__x);
      rf_gfx_vertex3f(fVar12 * radius_bottom,0.0,fVar13 * radius_bottom);
      fVar12 = sinf(fVar11);
      fVar11 = cosf(fVar11);
      rf_gfx_vertex3f(fVar12 * radius_top,height,fVar11 * radius_top);
      uVar9 = uVar9 + SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x168)) / auVar4,0);
    } while (uVar9 < 0x168);
    uVar9 = 0;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar8;
    do {
      rf_gfx_vertex3f(0.0,height,0.0);
      fVar11 = sinf((float)(long)uVar9 * 0.017453292);
      fVar12 = cosf((float)(long)uVar9 * 0.017453292);
      rf_gfx_vertex3f(fVar11 * radius_top,height,fVar12 * radius_top);
      lVar2 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x168)) / auVar5,0) + uVar9;
      uVar9 = uVar9 + 0x168 / (ulong)uVar10;
      fVar11 = (float)lVar2 * 0.017453292;
      fVar12 = sinf(fVar11);
      fVar11 = cosf(fVar11);
      rf_gfx_vertex3f(fVar12 * radius_top,height,fVar11 * radius_top);
    } while (uVar9 < 0x168);
  }
  uVar9 = 0;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar8;
  do {
    rf_gfx_vertex3f(0.0,0.0,0.0);
    fVar12 = (float)(long)(0x168 / (ulong)uVar10 + uVar9) * 0.017453292;
    fVar11 = sinf(fVar12);
    fVar12 = cosf(fVar12);
    rf_gfx_vertex3f(fVar11 * radius_bottom,0.0,fVar12 * radius_bottom);
    fVar11 = sinf((float)(long)uVar9 * 0.017453292);
    fVar12 = cosf((float)(long)uVar9 * 0.017453292);
    rf_gfx_vertex3f(fVar11 * radius_bottom,0.0,fVar12 * radius_bottom);
    uVar9 = uVar9 + SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x168)) / auVar7,0);
  } while (uVar9 < 0x168);
  rf_gfx_end();
  rf_gfx_pop_matrix();
  return;
}

Assistant:

RF_API void rf_draw_cylinder(rf_vec3 position, float radius_top, float radius_bottom, float height, int sides, rf_color color)
{
    if (sides < 3) sides = 3;

    int num_vertex = sides*6;
    if (rf_gfx_check_buffer_limit(num_vertex)) rf_gfx_draw();

    rf_gfx_push_matrix();
    rf_gfx_translatef(position.x, position.y, position.z);

    rf_gfx_begin(RF_TRIANGLES);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);

    if (radius_top > 0)
    {
        // Draw Body -------------------------------------------------------------------------------------
        for (rf_int i = 0; i < 360; i += 360 / sides)
        {
            rf_gfx_vertex3f(sinf(RF_DEG2RAD * i) * radius_bottom, 0, cosf(RF_DEG2RAD * i) * radius_bottom);                                   // Bottom Left
            rf_gfx_vertex3f(sinf(RF_DEG2RAD * (i + 360 / sides)) * radius_bottom, 0,   cosf(RF_DEG2RAD * (i + 360 / sides)) * radius_bottom); // Bottom Right
            rf_gfx_vertex3f(sinf(RF_DEG2RAD * (i + 360 / sides)) * radius_top, height, cosf(RF_DEG2RAD * (i + 360 / sides)) * radius_top);    // Top Right

            rf_gfx_vertex3f(sinf(RF_DEG2RAD * i) * radius_top, height, cosf(RF_DEG2RAD * i) * radius_top);                                 // Top Left
            rf_gfx_vertex3f(sinf(RF_DEG2RAD * i) * radius_bottom, 0,   cosf(RF_DEG2RAD * i) * radius_bottom);                              // Bottom Left
            rf_gfx_vertex3f(sinf(RF_DEG2RAD * (i + 360 / sides)) * radius_top, height, cosf(RF_DEG2RAD * (i + 360 / sides)) * radius_top); // Top Right
        }

        // Draw Cap --------------------------------------------------------------------------------------
        for (rf_int i = 0; i < 360; i += 360/sides)
        {
            rf_gfx_vertex3f(0, height, 0);
            rf_gfx_vertex3f(sinf(RF_DEG2RAD*i)*radius_top, height, cosf(RF_DEG2RAD*i)*radius_top);
            rf_gfx_vertex3f(sinf(RF_DEG2RAD*(i + 360/sides))*radius_top, height, cosf(RF_DEG2RAD*(i + 360/sides))*radius_top);
        }
    }
    else
    {
        // Draw Cone -------------------------------------------------------------------------------------
        for (rf_int i = 0; i < 360; i += 360/sides)
        {
            rf_gfx_vertex3f(0, height, 0);
            rf_gfx_vertex3f(sinf(RF_DEG2RAD*i)*radius_bottom, 0, cosf(RF_DEG2RAD*i)*radius_bottom);
            rf_gfx_vertex3f(sinf(RF_DEG2RAD*(i + 360/sides))*radius_bottom, 0, cosf(RF_DEG2RAD*(i + 360/sides))*radius_bottom);
        }
    }

    // Draw Base -----------------------------------------------------------------------------------------
    for (rf_int i = 0; i < 360; i += 360/sides)
    {
        rf_gfx_vertex3f(0, 0, 0);
        rf_gfx_vertex3f(sinf(RF_DEG2RAD*(i + 360/sides))*radius_bottom, 0, cosf(RF_DEG2RAD*(i + 360/sides))*radius_bottom);
        rf_gfx_vertex3f(sinf(RF_DEG2RAD*i)*radius_bottom, 0, cosf(RF_DEG2RAD*i)*radius_bottom);
    }

    rf_gfx_end();
    rf_gfx_pop_matrix();
}